

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O3

int async(thread_pool_t *pool,future_t *future,callable_t callable)

{
  int iVar1;
  wrap_t *wrapper;
  runnable_t *prVar2;
  
  iVar1 = future_init(future);
  if (iVar1 == -1) {
    async_cold_4();
  }
  else {
    wrapper = (wrap_t *)malloc(0x28);
    if (wrapper == (wrap_t *)0x0) {
      async_cold_3();
    }
    else {
      (wrapper->callable).argsz = callable.argsz;
      (wrapper->callable).function = callable.function;
      (wrapper->callable).arg = callable.arg;
      wrapper->future = future;
      wrapper->runnable = (runnable_t *)0x0;
      prVar2 = callable_to_runnable(wrapper);
      if (prVar2 == (runnable_t *)0x0) {
        async_cold_2();
      }
      else {
        wrapper->runnable = prVar2;
        iVar1 = defer(pool,*prVar2);
        if (iVar1 == 0) {
          return 0;
        }
        async_cold_1();
      }
    }
  }
  return -1;
}

Assistant:

int async(thread_pool_t *pool, future_t *future, callable_t callable) {
    if (future_init(future) == -1) {
        err("async(): future_init() failed as future is NULL.\n");
        return -1;
    }

    wrap_t *wrapper = malloc(sizeof(wrap_t));

    if (wrapper == NULL) {
        err("async(): malloc failed for creating wrapper.\n");
        return -1;
    }

    wrapper->callable = callable;
    wrapper->future = future;
    wrapper->runnable = NULL;

    runnable_t *my_runnable = callable_to_runnable(wrapper);

    if (my_runnable == NULL) {
        err("async(): malloc failed for creating new runnable.\n");
        return -1;
    }

    wrapper->runnable = my_runnable;

    if (defer(pool, *my_runnable) != 0) {
        err("async(): Submitting new callable task failed.\n");
        free(wrapper);
        free(my_runnable);
        return -1;
    }

    return 0;
}